

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O3

Rational<long> Common::Number::gcd<long>(long *lhs,long *rhs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Rational<long> RVar5;
  long lVar4;
  
  lVar4 = *lhs;
  lVar3 = *rhs;
  while (lVar3 != 0) {
    lVar1 = lVar4 % lVar3;
    lVar4 = lVar3;
    lVar3 = lVar1;
  }
  lVar3 = 1;
  lVar1 = lVar4;
  do {
    lVar2 = lVar3;
    lVar3 = lVar1 % lVar2;
    lVar1 = lVar2;
  } while (lVar3 != 0);
  lVar3 = 0;
  if (lVar2 + 1U < 3) {
    lVar3 = lVar2;
  }
  lVar1 = lVar4 / lVar2;
  if (lVar3 < 0) {
    lVar1 = -(lVar4 / lVar2);
  }
  lVar4 = 1;
  if (lVar3 >= 0) {
    lVar4 = lVar3;
  }
  RVar5._denominator = lVar4;
  RVar5._numerator = lVar1;
  return RVar5;
}

Assistant:

const Rational<T> gcd(const T &lhs, const T &rhs) {
		return Rational<T>::gcd(lhs, rhs);
	}